

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O2

string * getCPUModel_abi_cxx11_(void)

{
  istream *piVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string info;
  string line;
  ifstream cpufile;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&cpufile,"/proc/cpuinfo",_S_in);
  if ((abStack_208[*(long *)(_cpufile + -0x18)] & 5) == 0) {
    info._M_dataplus._M_p = (pointer)&info.field_2;
    info._M_string_length = 0;
    info.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    do {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&cpufile,(string *)&line);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) goto LAB_00304901;
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&line,"model name",0);
    } while (sVar2 == 0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&info,&line);
LAB_00304901:
    std::ifstream::close();
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&info,"model name",0);
    if (sVar2 == 0xffffffffffffffff) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      in_RDI->_M_string_length = 0;
      (in_RDI->field_2)._M_local_buf[0] = '\0';
    }
    else {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&info,':',sVar2);
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of(&info,"\n\r",sVar2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_RDI,&info,sVar3 + 1,~sVar3 + sVar2);
      if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] == '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (in_RDI);
      }
    }
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&info);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  std::ifstream::~ifstream(&cpufile);
  return in_RDI;
}

Assistant:

inline std::string getCPUModel()
{  // Get the cpu from /proc/cpuinfo
    std::ifstream cpufile("/proc/cpuinfo");
    if (!cpufile) {
        return std::string{};
    }
    std::string info;
    std::string line;
    while (getline(cpufile, line)) {
        if (line.find("model name") != std::string::npos) {
            info.append(line);
            break;
        }
    }
    cpufile.close();
    auto modelLoc = info.find("model name");

    if (modelLoc != std::string::npos) {
        auto cloc = info.find_first_of(':', modelLoc);
        auto eline = info.find_first_of("\n\r\0", modelLoc);
        auto modelString = info.substr(cloc + 1, eline - cloc - 1);
        if (modelString.back() == '\0') {
            modelString.pop_back();
        }
        return modelString;
    }
    return std::string{};
}